

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

gravity_value_t convert_value2bool(gravity_vm *vm,gravity_value_t v)

{
  _Bool _Var1;
  int iVar2;
  gravity_class_t *pgVar3;
  gravity_closure_t *closure_00;
  gravity_closure_t *pgVar4;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  gravity_class_t *pgVar6;
  gravity_closure_t *closure;
  gravity_string_t *string;
  gravity_vm *vm_local;
  gravity_value_t v_local;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_10;
  
  pgVar3 = gravity_class_bool;
  aVar5 = v.field_1;
  pgVar6 = v.isa;
  unique0x100001ec = v;
  if (pgVar6 != gravity_class_bool) {
    if (pgVar6 == gravity_class_int) {
      local_10 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                 (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                 (long)(int)(uint)((double)aVar5.n != 0.0);
      v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
    }
    else if (pgVar6 == gravity_class_float) {
      local_10 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                 (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(int)(uint)(aVar5.f != 0.0);
      v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
    }
    else if ((pgVar6 == gravity_class_null) && ((double)aVar5.n == 0.0)) {
      local_10.n = 0;
      v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
    }
    else if ((pgVar6 == gravity_class_null) && ((double)aVar5.n == 4.94065645841247e-324)) {
      local_10.n = 0;
      v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
    }
    else if (pgVar6 == gravity_class_string) {
      if (*(int *)((long)&(aVar5.p)->identifier + 4) == 0) {
        local_10.n = 0;
        v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
      }
      else {
        iVar2 = strcmp((char *)(aVar5.p)->objclass,"false");
        local_10 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                   (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(int)(uint)(iVar2 != 0);
        v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)pgVar3;
      }
    }
    else {
      pgVar3 = gravity_value_getclass(v);
      closure_00 = gravity_vm_fastlookup(vm,pgVar3,0x1b);
      if ((closure_00 == (gravity_closure_t *)0x0) ||
         (((closure_00->f->tag == EXEC_TYPE_INTERNAL &&
           ((code *)(closure_00->f->field_9).field_0.cpool.n == convert_object_bool)) ||
          (pgVar4 = gravity_vm_getclosure(vm), pgVar4 == closure_00)))) {
        local_10.n = 1;
        v_local.field_1 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)gravity_class_bool;
      }
      else {
        _Var1 = gravity_vm_runclosure(vm,closure_00,v,(gravity_value_t *)0x0,0);
        if (_Var1) {
          join_0x00000010_0x00000000_ = gravity_vm_result(vm);
        }
        else {
          stack0xffffffffffffffe8 = (gravity_value_t)ZEXT816(0);
        }
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

inline gravity_value_t convert_value2bool (gravity_vm *vm, gravity_value_t v) {
    if (VALUE_ISA_BOOL(v)) return v;

    // handle conversion for basic classes
    if (VALUE_ISA_INT(v)) return VALUE_FROM_BOOL(v.n != 0);
    if (VALUE_ISA_FLOAT(v)) return VALUE_FROM_BOOL(v.f != 0.0);
    if (VALUE_ISA_NULL(v)) return VALUE_FROM_FALSE;
    if (VALUE_ISA_UNDEFINED(v)) return VALUE_FROM_FALSE;
    if (VALUE_ISA_STRING(v)) {
        gravity_string_t *string = VALUE_AS_STRING(v);
        if (string->len == 0) return VALUE_FROM_FALSE;
        return VALUE_FROM_BOOL((strcmp(string->s, "false") != 0));
    }

    // check if class implements the Bool method
    gravity_closure_t *closure = gravity_vm_fastlookup(vm, gravity_value_getclass(v), GRAVITY_BOOL_INDEX);

    // sanity check (and break recursion)
    if ((!closure) || ((closure->f->tag == EXEC_TYPE_INTERNAL) && (closure->f->internal == convert_object_bool)) ||
        gravity_vm_getclosure(vm) == closure) return VALUE_FROM_BOOL(1);

    // execute closure and return its value
    if (gravity_vm_runclosure(vm, closure, v, NULL, 0)) return gravity_vm_result(vm);

    return VALUE_FROM_ERROR(NULL);
}